

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O1

bool __thiscall pg::SSISolver::si_val_less(SSISolver *this,int a,int b)

{
  int *piVar1;
  byte bVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  if (a == b) {
LAB_0015e8d0:
    bVar2 = 0;
  }
  else {
    piVar1 = this->val;
    uVar4 = this->k;
    iVar5 = uVar4 * a;
    iVar6 = uVar4 * b;
    piVar3 = piVar1;
    do {
      iVar7 = 0;
      if ((int)uVar4 < 1) goto LAB_0015e8d0;
      uVar4 = uVar4 - 1;
      if (a != -1) {
        iVar7 = piVar1[(long)iVar5 + (ulong)uVar4];
      }
      if (b == -1) {
        iVar8 = 0;
      }
      else {
        iVar8 = piVar1[(long)iVar6 + (ulong)uVar4];
      }
      if (iVar7 != iVar8) {
        if ((uVar4 & 1) == 0) {
          piVar3 = (int *)(ulong)(iVar7 < iVar8);
        }
        else {
          piVar3 = (int *)(ulong)(iVar8 < iVar7);
        }
      }
      bVar2 = (byte)piVar3;
    } while (iVar7 == iVar8);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool
SSISolver::si_val_less(int a, int b)
{
    // if a == b, then of course return false
    if (a == b) return false;
    const int *a_val = val + k*a;
    const int *b_val = val + k*b;
    // find highest priority where they differ
    for (int i=k-1; i>=0; i--) {
        const int a_i = a == -1 ? 0 : a_val[i];
        const int b_i = b == -1 ? 0 : b_val[i];
        if (a_i == b_i) continue;
        if (i&1) return a_i > b_i; // for odd priorities
        else return a_i < b_i;     // for even priorities
    }
    // equal
    return false;
}